

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O1

lua_Number lua_tonumberx(lua_State *L,int idx,int *isnum)

{
  TValue *obj;
  TValue n;
  TValue TStack_18;
  
  obj = index2addr(L,idx);
  if ((obj->tt_ != 3) && (obj = luaV_tonumber(obj,&TStack_18), obj == (TValue *)0x0)) {
    if (isnum == (int *)0x0) {
      return 0.0;
    }
    *isnum = 0;
    return 0.0;
  }
  if (isnum != (int *)0x0) {
    *isnum = 1;
  }
  return (lua_Number)(obj->value_).gc;
}

Assistant:

LUA_API lua_Number lua_tonumberx (lua_State *L, int idx, int *isnum) {
  TValue n;
  const TValue *o = index2addr(L, idx);
  if (tonumber(o, &n)) {
    if (isnum) *isnum = 1;
    return nvalue(o);
  }
  else {
    if (isnum) *isnum = 0;
    return 0;
  }
}